

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Group.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Grouping_Transform(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var8;
  runtime_error *prVar9;
  aiVector3D *pValue;
  string *psVar10;
  int pAttrIdx;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  aiVector3D center;
  vector<float,_std::allocator<float>_> tvec;
  aiVector3D translation;
  aiVector3D scale;
  string def;
  string use;
  string an;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_164;
  float local_15c;
  float local_118;
  aiVector3D local_104;
  vector<float,_std::allocator<float>_> local_f8;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  aiVector3D local_c8;
  aiVector3D local_bc;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_104.x = 0.0;
  local_104.y = 0.0;
  local_104.z = 0.0;
  local_bc.x = 1.0;
  local_bc.y = 1.0;
  local_bc.z = 1.0;
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  local_c8.z = 0.0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar6 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar6 < 1) {
    local_178 = 0.0;
    fVar15 = 0.0;
    local_15c = 0.0;
    local_16c = 0.0;
    local_170 = 0.0;
    local_164 = 1.0;
    local_174 = 1.0;
    local_17c = 0.0;
  }
  else {
    uVar11 = 0;
    local_17c = 0.0;
    local_170 = 0.0;
    local_16c = 0.0;
    local_15c = 0.0;
    local_174 = 1.0;
    local_164 = 1.0;
    fVar15 = 0.0;
    local_178 = 0.0;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar7 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar7),
                 (allocator<char> *)local_b0);
      iVar7 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar7 == 0) {
        iVar7 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar7);
        psVar10 = &local_90;
LAB_00643c02:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar7 == 0) {
          iVar7 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar7);
          psVar10 = &local_70;
          goto LAB_00643c02;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 != 0))
           && (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 != 0)) {
          iVar7 = std::__cxx11::string::compare((char *)&local_50);
          pValue = &local_104;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)&local_50);
            pValue = &local_bc;
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)&local_50);
              pValue = &local_c8;
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare((char *)&local_50);
                if (iVar7 == 0) {
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (float *)0x0;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_f8);
                  if ((long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start != 0x10) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_b0[0] = local_a0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b0,
                               "<Transform>: rotation vector must have 4 elements.","");
                    std::runtime_error::runtime_error(prVar9,(string *)local_b0);
                    *(undefined ***)prVar9 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_178 = *local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start;
                  local_170 = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[1];
                  local_174 = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[2];
                  local_17c = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[3];
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_50);
                  if (iVar7 != 0) {
                    Throw_IncorrectAttr(this,&local_50);
                    goto LAB_00643c27;
                  }
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (float *)0x0;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_f8);
                  if ((long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start != 0x10) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_b0[0] = local_a0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b0,
                               "<Transform>: scaleOrientation vector must have 4 elements.","");
                    std::runtime_error::runtime_error(prVar9,(string *)local_b0);
                    *(undefined ***)prVar9 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_16c = *local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start;
                  local_15c = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[1];
                  local_164 = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[2];
                  fVar15 = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[3];
                }
                operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_f8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_f8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                goto LAB_00643c27;
              }
            }
          }
          XML_ReadNode_GetAttrVal_AsVec3f(this,pAttrIdx,pValue);
        }
      }
LAB_00643c27:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar6 != pAttrIdx + 1U);
  }
  if (local_70._M_string_length == 0) {
    ParseHelper_Group_Begin(this,false);
    if (local_90._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
    }
    fVar16 = local_104.z * 0.0;
    fVar27 = local_104.x + local_104.y * 0.0 + fVar16 + local_c8.x;
    fVar31 = local_c8.x * 0.0 + 1.0;
    fVar28 = local_c8.x * 0.0 + 0.0;
    fVar24 = local_104.y + local_104.x * 0.0 + fVar16 + local_c8.y;
    fVar25 = local_c8.y * 0.0 + 0.0;
    fVar18 = local_c8.y * 0.0 + 1.0;
    fVar21 = local_104.x * 0.0 + local_104.y * 0.0;
    fVar23 = local_104.z + fVar21 + local_c8.z;
    fVar19 = local_c8.z * 0.0 + 0.0;
    fVar12 = local_c8.z * 0.0 + 1.0;
    fVar22 = fVar21 + fVar16 + 1.0;
    fVar16 = cosf(local_17c);
    fVar21 = sinf(local_17c);
    fVar26 = 1.0 - fVar16;
    fVar29 = local_178 * fVar26;
    fVar17 = fVar29 * local_170 - local_174 * fVar21;
    fVar20 = fVar29 * local_170 + local_174 * fVar21;
    fVar13 = fVar29 * local_174 + local_170 * fVar21;
    fVar30 = fVar29 * local_174 - local_170 * fVar21;
    fVar32 = local_170 * fVar26 * local_174;
    fVar14 = fVar32 - local_178 * fVar21;
    fVar32 = fVar32 + local_178 * fVar21;
    fVar21 = fVar29 * local_178 + fVar16;
    fVar29 = local_170 * local_170 * fVar26 + fVar16;
    fVar16 = fVar26 * local_174 * local_174 + fVar16;
    fVar26 = fVar27 * 0.0;
    fVar35 = fVar30 * fVar28 + fVar21 * fVar31 + fVar28 * fVar20 + fVar26;
    local_d0 = fVar32 * fVar28 + fVar17 * fVar31 + fVar28 * fVar29 + fVar26;
    fVar26 = fVar16 * fVar28 + fVar13 * fVar31 + fVar28 * fVar14 + fVar26;
    fVar27 = fVar31 * 0.0 + fVar28 * 0.0 + fVar28 * 0.0 + fVar27;
    fVar28 = fVar24 * 0.0;
    fVar36 = fVar30 * fVar25 + fVar21 * fVar25 + fVar18 * fVar20 + fVar28;
    local_cc = fVar32 * fVar25 + fVar17 * fVar25 + fVar18 * fVar29 + fVar28;
    fVar28 = fVar16 * fVar25 + fVar13 * fVar25 + fVar18 * fVar14 + fVar28;
    fVar24 = fVar18 * 0.0 + fVar25 * 0.0 + fVar25 * 0.0 + fVar24;
    fVar25 = fVar23 * 0.0;
    fVar37 = fVar30 * fVar12 + fVar21 * fVar19 + fVar19 * fVar20 + fVar25;
    fVar38 = fVar32 * fVar12 + fVar17 * fVar19 + fVar19 * fVar29 + fVar25;
    fVar25 = fVar16 * fVar12 + fVar13 * fVar19 + fVar19 * fVar14 + fVar25;
    fVar23 = fVar12 * 0.0 + fVar19 * 0.0 + fVar19 * 0.0 + fVar23;
    fVar12 = fVar22 * 0.0;
    fVar31 = fVar30 * 0.0 + fVar21 * 0.0 + fVar20 * 0.0 + fVar12;
    fVar33 = fVar32 * 0.0 + fVar17 * 0.0 + fVar29 * 0.0 + fVar12;
    fVar29 = fVar16 * 0.0 + fVar13 * 0.0 + fVar14 * 0.0 + fVar12;
    fVar16 = cosf(fVar15);
    fVar21 = sinf(fVar15);
    fVar14 = 1.0 - fVar16;
    fVar17 = local_16c * fVar14;
    fVar34 = fVar17 * local_15c - local_164 * fVar21;
    fVar41 = fVar17 * local_15c + local_164 * fVar21;
    fVar20 = fVar17 * local_164 + local_15c * fVar21;
    fVar19 = fVar17 * local_164 - local_15c * fVar21;
    fVar39 = local_15c * fVar14 * local_164;
    fVar13 = fVar39 - fVar21 * local_16c;
    fVar39 = fVar39 + fVar21 * local_16c;
    fVar21 = fVar17 * local_16c + fVar16;
    fVar17 = local_15c * fVar14 * local_15c + fVar16;
    fVar16 = fVar14 * local_164 * local_164 + fVar16;
    local_d8 = fVar27 * 0.0;
    fVar40 = fVar19 * fVar26 + fVar21 * fVar35 + fVar41 * local_d0 + local_d8;
    local_d4 = fVar39 * fVar26 + fVar34 * fVar35 + fVar17 * local_d0 + local_d8;
    local_d8 = fVar16 * fVar26 + fVar20 * fVar35 + fVar13 * local_d0 + local_d8;
    fVar27 = fVar26 * 0.0 + fVar35 * 0.0 + local_d0 * 0.0 + fVar27;
    fVar26 = fVar24 * 0.0;
    fVar18 = fVar19 * fVar28 + fVar21 * fVar36 + fVar41 * local_cc + fVar26;
    fVar30 = fVar39 * fVar28 + fVar34 * fVar36 + fVar17 * local_cc + fVar26;
    fVar26 = fVar16 * fVar28 + fVar20 * fVar36 + fVar13 * local_cc + fVar26;
    fVar24 = fVar28 * 0.0 + fVar36 * 0.0 + local_cc * 0.0 + fVar24;
    fVar32 = fVar23 * 0.0;
    fVar14 = fVar19 * fVar25 + fVar21 * fVar37 + fVar41 * fVar38 + fVar32;
    fVar35 = fVar39 * fVar25 + fVar34 * fVar37 + fVar17 * fVar38 + fVar32;
    fVar32 = fVar16 * fVar25 + fVar20 * fVar37 + fVar13 * fVar38 + fVar32;
    fVar23 = fVar25 * 0.0 + fVar37 * 0.0 + fVar38 * 0.0 + fVar23;
    fVar36 = fVar19 * fVar29 + fVar21 * fVar31 + fVar41 * fVar33 + fVar12;
    fVar34 = fVar39 * fVar29 + fVar34 * fVar31 + fVar17 * fVar33 + fVar12;
    fVar12 = fVar16 * fVar29 + fVar20 * fVar31 + fVar13 * fVar33 + fVar12;
    fVar22 = fVar29 * 0.0 + fVar31 * 0.0 + fVar33 * 0.0 + fVar22;
    fVar16 = fVar40 * 0.0;
    fVar21 = fVar16 + local_d4 * 0.0;
    fVar13 = local_d8 * 0.0;
    fVar28 = fVar27 * 0.0;
    fVar25 = local_bc.x * fVar40 + local_d4 * 0.0 + fVar13 + fVar28;
    fVar16 = local_bc.y * local_d4 + fVar16 + fVar13 + fVar28;
    fVar28 = local_bc.z * local_d8 + fVar21 + fVar28;
    fVar27 = fVar21 + fVar13 + fVar27;
    fVar20 = fVar30 * 0.0;
    fVar13 = fVar18 * 0.0;
    fVar17 = fVar13 + fVar20;
    fVar19 = fVar26 * 0.0;
    fVar21 = fVar24 * 0.0;
    fVar18 = local_bc.x * fVar18 + fVar20 + fVar19 + fVar21;
    fVar29 = local_bc.y * fVar30 + fVar13 + fVar19 + fVar21;
    fVar21 = local_bc.z * fVar26 + fVar17 + fVar21;
    fVar24 = fVar17 + fVar19 + fVar24;
    fVar19 = fVar35 * 0.0;
    fVar17 = fVar14 * 0.0;
    fVar20 = fVar17 + fVar19;
    fVar26 = fVar32 * 0.0;
    fVar13 = fVar23 * 0.0;
    fVar19 = local_bc.x * fVar14 + fVar19 + fVar26 + fVar13;
    fVar30 = local_bc.y * fVar35 + fVar17 + fVar26 + fVar13;
    fVar13 = local_bc.z * fVar32 + fVar20 + fVar13;
    fVar23 = fVar20 + fVar26 + fVar23;
    fVar20 = fVar34 * 0.0;
    fVar26 = fVar36 * 0.0;
    fVar32 = fVar26 + fVar20;
    fVar17 = fVar12 * 0.0;
    fVar14 = fVar22 * 0.0;
    fVar31 = local_bc.x * fVar36 + fVar20 + fVar17 + fVar14;
    fVar36 = local_bc.y * fVar34 + fVar26 + fVar17 + fVar14;
    fVar14 = local_bc.z * fVar12 + fVar32 + fVar14;
    fVar22 = fVar32 + fVar17 + fVar22;
    local_118 = -fVar15;
    fVar17 = cosf(-fVar15);
    fVar15 = sinf(local_118);
    fVar20 = 1.0 - fVar17;
    fVar33 = local_16c * fVar20;
    fVar32 = fVar33 * local_15c - local_164 * fVar15;
    fVar34 = fVar33 * local_15c + local_164 * fVar15;
    fVar12 = fVar33 * local_164 + local_15c * fVar15;
    fVar40 = fVar33 * local_164 - local_15c * fVar15;
    fVar38 = local_15c * fVar20 * local_164;
    fVar26 = fVar38 - local_16c * fVar15;
    fVar38 = fVar38 + local_16c * fVar15;
    fVar33 = fVar33 * local_16c + fVar17;
    fVar35 = local_15c * local_15c * fVar20 + fVar17;
    fVar17 = fVar20 * local_164 * local_164 + fVar17;
    fVar20 = fVar27 * 0.0;
    fVar37 = fVar40 * fVar28 + fVar33 * fVar25 + fVar34 * fVar16 + fVar20;
    fVar39 = fVar38 * fVar28 + fVar32 * fVar25 + fVar35 * fVar16 + fVar20;
    fVar20 = fVar17 * fVar28 + fVar12 * fVar25 + fVar26 * fVar16 + fVar20;
    fVar27 = fVar28 * 0.0 + fVar25 * 0.0 + fVar16 * 0.0 + fVar27;
    fVar16 = fVar24 * 0.0;
    fVar41 = fVar40 * fVar21 + fVar33 * fVar18 + fVar34 * fVar29 + fVar16;
    fVar28 = fVar38 * fVar21 + fVar32 * fVar18 + fVar35 * fVar29 + fVar16;
    fVar16 = fVar17 * fVar21 + fVar12 * fVar18 + fVar26 * fVar29 + fVar16;
    fVar24 = fVar21 * 0.0 + fVar18 * 0.0 + fVar29 * 0.0 + fVar24;
    fVar18 = fVar23 * 0.0;
    fVar21 = fVar40 * fVar13 + fVar33 * fVar19 + fVar34 * fVar30 + fVar18;
    fVar15 = fVar38 * fVar13 + fVar32 * fVar19 + fVar35 * fVar30 + fVar18;
    fVar18 = fVar17 * fVar13 + fVar12 * fVar19 + fVar26 * fVar30 + fVar18;
    fVar23 = fVar13 * 0.0 + fVar19 * 0.0 + fVar30 * 0.0 + fVar23;
    fVar13 = fVar22 * 0.0;
    fVar19 = fVar40 * fVar14 + fVar33 * fVar31 + fVar34 * fVar36 + fVar13;
    fVar25 = fVar38 * fVar14 + fVar32 * fVar31 + fVar35 * fVar36 + fVar13;
    fVar13 = fVar17 * fVar14 + fVar12 * fVar31 + fVar26 * fVar36 + fVar13;
    fVar22 = fVar14 * 0.0 + fVar31 * 0.0 + fVar36 * 0.0 + fVar22;
    fVar17 = -local_104.x;
    fVar12 = fVar27 * 0.0;
    fVar14 = fVar24 * 0.0;
    fVar26 = fVar23 * 0.0;
    fVar29 = fVar22 * 0.0;
    pCVar4 = this->NodeElement_Cur;
    *(float *)&pCVar4[1]._vptr_CX3DImporter_NodeElement =
         fVar37 + fVar39 * 0.0 + fVar20 * 0.0 + fVar12;
    *(float *)((long)&pCVar4[1]._vptr_CX3DImporter_NodeElement + 4) =
         fVar37 * 0.0 + fVar39 + fVar20 * 0.0 + fVar12;
    pCVar4[1].Type = (EType)(fVar37 * 0.0 + fVar39 * 0.0 + fVar20 + fVar12);
    *(float *)&pCVar4[1].field_0xc =
         ((fVar17 * fVar37 - fVar39 * local_104.y) - fVar20 * local_104.z) + fVar27;
    *(float *)&pCVar4[1].ID._M_dataplus._M_p = fVar41 + fVar28 * 0.0 + fVar16 * 0.0 + fVar14;
    *(float *)((long)&pCVar4[1].ID._M_dataplus._M_p + 4) =
         fVar41 * 0.0 + fVar28 + fVar16 * 0.0 + fVar14;
    *(float *)&pCVar4[1].ID._M_string_length = fVar41 * 0.0 + fVar28 * 0.0 + fVar16 + fVar14;
    *(float *)((long)&pCVar4[1].ID._M_string_length + 4) =
         ((fVar17 * fVar41 - fVar28 * local_104.y) - fVar16 * local_104.z) + fVar24;
    *(float *)&pCVar4[1].ID.field_2 = fVar21 + fVar15 * 0.0 + fVar18 * 0.0 + fVar26;
    *(float *)((long)&pCVar4[1].ID.field_2 + 4) = fVar21 * 0.0 + fVar15 + fVar18 * 0.0 + fVar26;
    *(float *)((long)&pCVar4[1].ID.field_2 + 8) = fVar21 * 0.0 + fVar15 * 0.0 + fVar18 + fVar26;
    *(float *)((long)&pCVar4[1].ID.field_2 + 0xc) =
         ((fVar17 * fVar21 - fVar15 * local_104.y) - fVar18 * local_104.z) + fVar23;
    *(float *)&pCVar4[1].Parent = fVar19 + fVar25 * 0.0 + fVar13 * 0.0 + fVar29;
    *(float *)((long)&pCVar4[1].Parent + 4) = fVar19 * 0.0 + fVar25 + fVar13 * 0.0 + fVar29;
    *(float *)&pCVar4[1].Child.
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node.super__List_node_base._M_next =
         fVar19 * 0.0 + fVar25 * 0.0 + fVar13 + fVar29;
    *(float *)((long)&pCVar4[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next + 4) =
         ((fVar17 * fVar19 - fVar25 * local_104.y) - fVar13 * local_104.z) + fVar22;
    iVar7 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar7 != '\0') {
      ParseHelper_Node_Exit(this);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)0x0;
    XML_CheckNode_MustBeEmpty(this);
    if (local_90._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,&local_70,ENET_Group,(CX3DImporter_NodeElement **)&local_50);
    if (!bVar5) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_50._M_dataplus._M_p;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Grouping_Transform()
{
    aiVector3D center(0, 0, 0);
    float rotation[4] = {0, 0, 1, 0};
    aiVector3D scale(1, 1, 1);// A value of zero indicates that any child geometry shall not be displayed
    float scale_orientation[4] = {0, 0, 1, 0};
    aiVector3D translation(0, 0, 0);
    aiMatrix4x4 matr, tmatr;
    std::string use, def;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("center", center, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("translation", translation, XML_ReadNode_GetAttrVal_AsVec3f);
		if(an == "rotation")
		{
			std::vector<float> tvec;

			XML_ReadNode_GetAttrVal_AsArrF(idx, tvec);
			if(tvec.size() != 4) throw DeadlyImportError("<Transform>: rotation vector must have 4 elements.");

			memcpy(rotation, tvec.data(), sizeof(rotation));

			continue;
		}

		if(an == "scaleOrientation")
		{
			std::vector<float> tvec;
			XML_ReadNode_GetAttrVal_AsArrF(idx, tvec);
            if ( tvec.size() != 4 )
            {
                throw DeadlyImportError( "<Transform>: scaleOrientation vector must have 4 elements." );
            }

			::memcpy(scale_orientation, tvec.data(), sizeof(scale_orientation) );

			continue;
		}

	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne( nullptr );

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin();// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
        if ( !def.empty() )
        {
            NodeElement_Cur->ID = def;
        }

		//
		// also set values specific to this type of group
		//
		// calculate transformation matrix
		aiMatrix4x4::Translation(translation, matr);// T
		aiMatrix4x4::Translation(center, tmatr);// C
		matr *= tmatr;
		aiMatrix4x4::Rotation(rotation[3], aiVector3D(rotation[0], rotation[1], rotation[2]), tmatr);// R
		matr *= tmatr;
		aiMatrix4x4::Rotation(scale_orientation[3], aiVector3D(scale_orientation[0], scale_orientation[1], scale_orientation[2]), tmatr);// SR
		matr *= tmatr;
		aiMatrix4x4::Scaling(scale, tmatr);// S
		matr *= tmatr;
		aiMatrix4x4::Rotation(-scale_orientation[3], aiVector3D(scale_orientation[0], scale_orientation[1], scale_orientation[2]), tmatr);// -SR
		matr *= tmatr;
		aiMatrix4x4::Translation(-center, tmatr);// -C
		matr *= tmatr;
		// and assign it
		((CX3DImporter_NodeElement_Group*)NodeElement_Cur)->Transformation = matr;
		// in grouping set of nodes check X3DMetadataObject is not needed, because it is done in <Scene> parser function.

		// for empty element exit from node in that place
        if ( mReader->isEmptyElement() )
        {
            ParseHelper_Node_Exit();
        }
	}// if(!use.empty()) else
}